

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CellTypeDirector.cpp
# Opt level: O0

void __thiscall CellTypeDirector::makeWaterCell(CellTypeDirector *this)

{
  uint uVar1;
  element_type *peVar2;
  RandomGenerator *pRVar3;
  Config *pCVar4;
  pair<int,_int> pVar5;
  CellTypeDirector *this_local;
  
  peVar2 = std::
           __shared_ptr_access<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar2->_vptr_AbstractCellTypeBuilder[2])(peVar2,0);
  peVar2 = std::
           __shared_ptr_access<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar2->_vptr_AbstractCellTypeBuilder[3])(peVar2,1);
  peVar2 = std::
           __shared_ptr_access<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pRVar3 = RandomGenerator::getInstance();
  pCVar4 = Config::getInstance();
  pVar5 = Config::getWaterWaterLevel(pCVar4);
  uVar1 = RandomGenerator::randNormalInt(pRVar3,pVar5);
  (*peVar2->_vptr_AbstractCellTypeBuilder[5])(peVar2,(ulong)uVar1);
  peVar2 = std::
           __shared_ptr_access<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pRVar3 = RandomGenerator::getInstance();
  pCVar4 = Config::getInstance();
  pVar5 = Config::getWaterPlantsCount(pCVar4);
  uVar1 = RandomGenerator::randNormalInt(pRVar3,pVar5);
  (*peVar2->_vptr_AbstractCellTypeBuilder[4])(peVar2,(ulong)uVar1);
  return;
}

Assistant:

void CellTypeDirector::makeWaterCell() {
  builderPtr -> setType(CellType::cellType::WATER);
  builderPtr -> setClimate(CellType::climateType::TEMPERATE);
  builderPtr -> setWaterLevel(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getWaterWaterLevel()));
  builderPtr -> setPlantFood(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getWaterPlantsCount()));
}